

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitread.c
# Opt level: O1

MPP_RET mpp_read_bits(BitReadCtx_t *bitctx,RK_S32 num_bits,RK_S32 *out)

{
  int iVar1;
  char cVar2;
  MPP_RET MVar3;
  int iVar4;
  
  *out = 0;
  iVar4 = num_bits;
  if (num_bits < 0x20) {
    do {
      cVar2 = (char)bitctx->num_remaining_bits_in_curr_byte_;
      if (iVar4 <= bitctx->num_remaining_bits_in_curr_byte_) {
        *out = ~(-1 << ((byte)num_bits & 0x1f)) &
               ((uint)(bitctx->curr_byte_ >> (cVar2 - (char)iVar4 & 0x3fU)) | *out);
        bitctx->num_remaining_bits_in_curr_byte_ = bitctx->num_remaining_bits_in_curr_byte_ - iVar4;
        bitctx->used_bits = bitctx->used_bits + num_bits;
        return MPP_OK;
      }
      *out = *out | (uint)(bitctx->curr_byte_ << ((char)iVar4 - cVar2 & 0x3fU));
      iVar1 = bitctx->num_remaining_bits_in_curr_byte_;
      MVar3 = (*bitctx->update_curbyte)(bitctx);
      iVar4 = iVar4 - iVar1;
    } while (MVar3 == MPP_OK);
  }
  return MPP_ERR_READ_BIT;
}

Assistant:

MPP_RET mpp_read_bits(BitReadCtx_t *bitctx, RK_S32 num_bits, RK_S32 *out)
{
    RK_S32 bits_left = num_bits;
    *out = 0;
    if (num_bits > 31) {
        return  MPP_ERR_READ_BIT;
    }
    while (bitctx->num_remaining_bits_in_curr_byte_ < bits_left) {
        // Take all that's left in current byte, shift to make space for the rest.
        *out |= (bitctx->curr_byte_ << (bits_left - bitctx->num_remaining_bits_in_curr_byte_));
        bits_left -= bitctx->num_remaining_bits_in_curr_byte_;
        if (bitctx->update_curbyte(bitctx)) {
            return  MPP_ERR_READ_BIT;
        }
    }
    *out |= (bitctx->curr_byte_ >> (bitctx->num_remaining_bits_in_curr_byte_ - bits_left));
    *out &= ((1 << num_bits) - 1);
    bitctx->num_remaining_bits_in_curr_byte_ -= bits_left;
    bitctx->used_bits += num_bits;

    return MPP_OK;
}